

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O3

void __thiscall
TasGrid::GridWavelet::getDifferentiationWeights(GridWavelet *this,double *x,double *weights)

{
  uint uVar1;
  size_type sVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> local_weights;
  allocator_type local_51;
  vector<double,_std::allocator<double>_> local_50;
  size_type local_38;
  
  lVar5 = 0x18;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = 0x40;
  }
  uVar1 = *(uint *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar5);
  local_38 = (size_type)(int)uVar1;
  uVar6 = (ulong)uVar1;
  if (0 < (long)local_38) {
    uVar7 = 0;
    do {
      evalDiffBasis(this,(int *)(*(long *)((long)&(this->super_BaseCanonicalGrid).
                                                  _vptr_BaseCanonicalGrid + lVar5) * uVar7 * 4 +
                                *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions +
                                         lVar5)),x,
                    weights + (long)(int)uVar7 *
                              (long)(this->super_BaseCanonicalGrid).num_dimensions);
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if ((this->inter_matrix).num_rows != uVar1) {
    buildInterpolationMatrix(this);
  }
  sVar2 = local_38;
  ::std::vector<double,_std::allocator<double>_>::vector(&local_50,local_38,&local_51);
  iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar7 = 0;
        pdVar4 = weights;
        do {
          local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = *pdVar4;
          uVar7 = uVar7 + 1;
          pdVar4 = pdVar4 + iVar3;
        } while (uVar6 != uVar7);
      }
      TasSparse::WaveletBasisMatrix::invertTransposed
                (&this->inter_matrix,(this->super_BaseCanonicalGrid).acceleration,
                 local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
      if (0 < (int)sVar2) {
        uVar7 = 0;
        pdVar4 = weights;
        do {
          *pdVar4 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
          uVar7 = uVar7 + 1;
          pdVar4 = pdVar4 + iVar3;
        } while (uVar6 != uVar7);
      }
      lVar5 = lVar5 + 1;
      weights = weights + 1;
    } while (lVar5 < iVar3);
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridWavelet::getDifferentiationWeights(const double x[], double weights[]) const {
    const MultiIndexSet &work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();
    #pragma omp parallel for
    for (int i=0; i<num_points; i++) {
        evalDiffBasis(work.getIndex(i), x, &(weights[i * num_dimensions]));
    }
    if (inter_matrix.getNumRows() != num_points) buildInterpolationMatrix();
    // Solve the linear wavelet system for each direction/partial derivative and re-index.
    std::vector<double> local_weights(num_points);
    for (int d=0; d<num_dimensions; d++) {
        for (int i=0; i<num_points; i++)
            local_weights[i] = weights[i * num_dimensions + d];
        inter_matrix.invertTransposed(acceleration, local_weights.data());
        for (int i=0; i<num_points; i++)
            weights[i * num_dimensions + d] = local_weights[i];
    }
}